

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<float> __thiscall
qclab::dense::operator*(dense *this,SquareMatrix<float> *lhs,SquareMatrix<float> *rhs)

{
  long lVar1;
  float *pfVar2;
  float *__s;
  float *pfVar3;
  long lVar4;
  data_type extraout_RDX;
  float *pfVar5;
  long lVar6;
  float *pfVar7;
  int64_t k;
  long lVar8;
  ulong __n;
  float fVar9;
  SquareMatrix<float> SVar10;
  
  lVar1 = lhs->size_;
  if (lVar1 != rhs->size_) {
    __assert_fail("size_ == rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                  ,0xb0,
                  "SquareMatrix<T> &qclab::dense::SquareMatrix<float>::operator*=(const SquareMatrix<T> &) [T = float]"
                 );
  }
  if (lVar1 == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                  ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = float]");
  }
  __n = 0xffffffffffffffff;
  if ((ulong)(lVar1 * lVar1) >> 0x3e == 0) {
    __n = lVar1 * lVar1 * 4;
  }
  __s = (float *)operator_new__(__n);
  memset(__s,0,__n);
  pfVar2 = (lhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  if (lVar1 < 1) {
    (lhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
    if (pfVar2 == (float *)0x0) goto LAB_0010f9d8;
  }
  else {
    pfVar3 = (rhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pfVar5 = pfVar2;
      do {
        fVar9 = __s[lVar4 * lVar1 + lVar6];
        lVar8 = 0;
        pfVar7 = pfVar5;
        do {
          fVar9 = fVar9 + *pfVar7 * pfVar3[lVar8];
          __s[lVar4 * lVar1 + lVar6] = fVar9;
          lVar8 = lVar8 + 1;
          pfVar7 = pfVar7 + lVar1;
        } while (lVar1 != lVar8);
        lVar6 = lVar6 + 1;
        pfVar5 = pfVar5 + 1;
      } while (lVar6 != lVar1);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + lVar1;
    } while (lVar4 != lVar1);
    (lhs->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
  }
  operator_delete__(pfVar2);
LAB_0010f9d8:
  SquareMatrix<float>::SquareMatrix((SquareMatrix<float> *)this,lhs);
  SVar10.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  SVar10.size_ = (size_type_conflict)this;
  return SVar10;
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }